

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normal_dist.hpp
# Opt level: O2

result_type_conflict1 __thiscall
trng::normal_dist<float>::cdf(normal_dist<float> *this,result_type_conflict1 x)

{
  float fVar1;
  
  fVar1 = math::Phi((x - (this->P).mu_) / (this->P).sigma_);
  return fVar1;
}

Assistant:

cdf(result_type x) const {
      x -= P.mu();
      x /= P.sigma();
      return math::Phi(x);
    }